

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::LoadBlockIndexDB(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *this_00;
  pointer *ppCVar1;
  int iVar2;
  iterator __position;
  pointer pCVar3;
  BlockTreeDB *this_01;
  string_view source_file;
  bool bVar4;
  bool bVar5;
  Logger *pLVar6;
  FILE *pFVar7;
  _Rb_tree_node_base *p_Var8;
  uint *puVar9;
  long lVar10;
  int *in_R8;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  pair<unsigned_char,_int> pVar15;
  _Self __tmp;
  _Hash_node_base *p_Var16;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  int max_blockfile_num;
  set<int,_std::less<int>,_std::allocator<int>_> setBlkDataFiles;
  FlatFilePos pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  Level level;
  char *fmt;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_f0 [2];
  undefined1 local_e8 [32];
  _Base_ptr p_Stack_c8;
  size_t local_c0;
  FlatFilePos local_98 [4];
  vector<std::byte,_std::allocator<std::byte>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = LoadBlockIndex(this,snapshot_blockhash);
  if (bVar4) {
    local_f0[0] = 0;
    CDBWrapper::Read<unsigned_char,int>
              (&((this->m_block_tree_db)._M_t.
                 super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                 .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                super_CDBWrapper,"l\x01",local_f0);
    this_00 = &this->m_blockfile_info;
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              (this_00,(long)local_f0[0] + 1);
    pLVar6 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar6);
    if (bVar4) {
      local_e8._8_8_ = 0;
      local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
      local_e8._0_8_ = (long)local_e8 + 0x10;
      tinyformat::format<char[17],int>
                (&local_58,(tinyformat *)"%s: last block file = %i\n","LoadBlockIndexDB",
                 (char (*) [17])local_f0,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar6 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x5e;
      local_58._M_string_length = 0xfcb844;
      in_stack_ffffffffffffff00 = 2;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      str._M_str = (char *)local_e8._0_8_;
      str._M_len = local_e8._8_8_;
      logging_function_02._M_str = "LoadBlockIndexDB";
      logging_function_02._M_len = 0x10;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_02,source_file,0x1fc,ALL,Info);
      if (local_e8._0_8_ != (long)local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
    }
    if (-1 < local_f0[0]) {
      lVar13 = -1;
      pVar15.first = 'f';
      pVar15._1_3_ = 0;
      pVar15.second = 0;
      lVar10 = 0;
      do {
        local_e8._0_8_ = pVar15;
        CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                  (&((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                    super_CDBWrapper,(pair<unsigned_char,_int> *)local_e8,
                   (CBlockFileInfo *)
                   ((long)&((this->m_blockfile_info).
                            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
                            _M_impl.super__Vector_impl_data._M_start)->nBlocks + lVar10));
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 0x28;
        pVar15 = (pair<unsigned_char,_int>)((long)pVar15 + 0x100000000);
      } while (lVar13 < local_f0[0]);
    }
    CBlockFileInfo::ToString_abi_cxx11_
              ((string *)local_e8,
               (this_00->super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>).
               _M_impl.super__Vector_impl_data._M_start + local_f0[0]);
    fmt = "LoadBlockIndexDB";
    level = 0xfcbb9c;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function._M_str = "LoadBlockIndexDB";
    logging_function._M_len = 0x10;
    LogPrintf_<char[17],std::__cxx11::string>
              (logging_function,source_file_00,0x200,TOR,0xfcbb9c,"LoadBlockIndexDB",
               (char (*) [17])local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    if (local_e8._0_8_ != (long)local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    iVar2 = local_f0[0];
    local_e8[0] = '\0';
    local_e8._1_3_ = 0;
    local_e8._4_4_ = 0;
    local_e8._8_8_ = 0;
    local_e8._16_8_ = local_e8._16_8_ & 0xffffffff00000000;
    local_e8._24_8_ = 0;
    p_Stack_c8 = (_Base_ptr)0x0;
    local_58._M_dataplus._M_p = (pointer)((ulong)(local_f0[0] + 1) << 0x20 | 0x66);
    bVar4 = CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                      (&((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                        super_CDBWrapper,(pair<unsigned_char,_int> *)&local_58,
                       (CBlockFileInfo *)local_e8);
    if (bVar4) {
      uVar14 = iVar2 + 2;
      do {
        __position._M_current =
             (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_blockfile_info).
            super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CBlockFileInfo,std::allocator<CBlockFileInfo>>::
          _M_realloc_insert<CBlockFileInfo_const&>
                    ((vector<CBlockFileInfo,std::allocator<CBlockFileInfo>> *)this_00,__position,
                     (CBlockFileInfo *)local_e8);
        }
        else {
          (__position._M_current)->nTimeLast = (uint64_t)p_Stack_c8;
          *(undefined8 *)&(__position._M_current)->nHeightLast = local_e8._16_8_;
          (__position._M_current)->nTimeFirst = local_e8._24_8_;
          (__position._M_current)->nBlocks = local_e8._0_4_;
          (__position._M_current)->nSize = local_e8._4_4_;
          (__position._M_current)->nUndoSize = local_e8._8_4_;
          (__position._M_current)->nHeightFirst = local_e8._12_4_;
          ppCVar1 = &(this->m_blockfile_info).
                     super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
        local_e8[0] = '\0';
        local_e8._1_3_ = 0;
        local_e8._4_4_ = 0;
        local_e8._8_8_ = 0;
        local_e8._16_8_ = local_e8._16_8_ & 0xffffffff00000000;
        local_e8._24_8_ = 0;
        p_Stack_c8 = (_Base_ptr)0x0;
        local_58._M_dataplus._M_p = (pointer)((ulong)uVar14 << 0x20 | 0x66);
        bVar4 = CDBWrapper::Read<std::pair<unsigned_char,int>,CBlockFileInfo>
                          (&((this->m_block_tree_db)._M_t.
                             super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                             .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                            super_CDBWrapper,(pair<unsigned_char,_int> *)&local_58,
                           (CBlockFileInfo *)local_e8);
        uVar14 = uVar14 + 1;
      } while (bVar4);
    }
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_01._M_len = 0x5e;
    logging_function_00._M_str = "LoadBlockIndexDB";
    logging_function_00._M_len = 0x10;
    ::LogPrintf_<>(logging_function_00,source_file_01,0x20b,
                   IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|
                   ESTIMATEFEE|RPC|ZMQ|BENCH|HTTP|TOR,level,fmt);
    local_e8._24_8_ = local_e8 + 8;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
    local_e8._16_8_ = 0;
    local_c0 = 0;
    p_Var16 = (this->m_block_index)._M_h._M_before_begin._M_nxt;
    p_Stack_c8 = (_Base_ptr)local_e8._24_8_;
    if (p_Var16 != (_Hash_node_base *)0x0) {
      do {
        if (((ulong)p_Var16[0x10]._M_nxt & 8) != 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     local_e8,(int *)((long)&p_Var16[8]._M_nxt + 4));
        }
        p_Var16 = p_Var16->_M_nxt;
      } while (p_Var16 != (_Hash_node_base *)0x0);
    }
    bVar4 = (_Rb_tree_node_base *)local_e8._24_8_ == (_Rb_tree_node_base *)(local_e8 + 8);
    if (!bVar4) {
      p_Var8 = (_Rb_tree_node_base *)local_e8._24_8_;
      do {
        local_98[0].nFile = p_Var8[1]._M_color;
        local_98[0].nPos = 0;
        pFVar7 = FlatFileSeq::Open(&this->m_block_file_seq,local_98,true);
        std::vector<std::byte,_std::allocator<std::byte>_>::vector(&local_78,&this->m_xor_key);
        local_58._M_string_length =
             (size_type)
             local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_58.field_2._M_allocated_capacity =
             (size_type)
             local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_58.field_2._8_8_ =
             local_78.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_58._M_dataplus._M_p = (pointer)pFVar7;
        AutoFile::~AutoFile((AutoFile *)&local_58);
        if (pFVar7 == (FILE *)0x0) goto LAB_00930538;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        bVar4 = p_Var8 == (_Rb_tree_node_base *)(local_e8 + 8);
      } while (!bVar4);
    }
    local_58._M_string_length = local_58._M_string_length & 0xffffffffffffff00;
    local_58._M_dataplus._M_p = (pointer)this;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_58);
    pCVar3 = (this->m_blockfile_info).
             super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)(this->m_blockfile_info).
                   super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar3;
    if (lVar10 != 0) {
      lVar10 = (lVar10 >> 3) * -0x3333333333333333;
      bVar5 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_engaged;
      iVar2 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int>._M_payload._M_value;
      puVar9 = &pCVar3->nHeightLast;
      uVar11 = 0;
      do {
        bVar12 = iVar2 <= (int)*puVar9 & bVar5;
        (this->m_blockfile_cursors)._M_elems[bVar12].
        super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
        super__Optional_payload_base<node::BlockfileCursor>._M_payload =
             (_Storage<node::BlockfileCursor,_true>)(uVar11 & 0xffffffff);
        if ((this->m_blockfile_cursors)._M_elems[bVar12].
            super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
            super__Optional_payload_base<node::BlockfileCursor>._M_engaged == false) {
          (this->m_blockfile_cursors)._M_elems[bVar12].
          super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
          super__Optional_payload_base<node::BlockfileCursor>._M_engaged = true;
        }
        uVar11 = uVar11 + 1;
        puVar9 = puVar9 + 10;
      } while (lVar10 + (ulong)(lVar10 == 0) != uVar11);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_58);
    this_01 = (this->m_block_tree_db)._M_t.
              super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>.
              _M_t.
              super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
              .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"prunedblockfiles","");
    kernel::BlockTreeDB::ReadFlag(this_01,&local_58,&this->m_have_pruned);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (this->m_have_pruned == true) {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_02._M_len = 0x5e;
      logging_function_01._M_str = "LoadBlockIndexDB";
      logging_function_01._M_len = 0x10;
      ::LogPrintf_<>(logging_function_01,source_file_02,0x225,
                     IPC|I2P|VALIDATION|LEVELDB|QT|COINDB|PROXY|RAND|CMPCTBLOCK|REINDEX|ADDRMAN|
                     ESTIMATEFEE|RPC|WALLETDB|ZMQ|BENCH|TOR,level,fmt);
    }
    bVar5 = CDBWrapper::Exists<unsigned_char>
                      (&((this->m_block_tree_db)._M_t.
                         super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                         .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl)->
                        super_CDBWrapper,"Rl\x01");
    if (bVar5) {
      LOCK();
      (this->m_blockfiles_indexed)._M_base._M_i = false;
      UNLOCK();
    }
LAB_00930538:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_e8);
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool BlockManager::LoadBlockIndexDB(const std::optional<uint256>& snapshot_blockhash)
{
    if (!LoadBlockIndex(snapshot_blockhash)) {
        return false;
    }
    int max_blockfile_num{0};

    // Load block file info
    m_block_tree_db->ReadLastBlockFile(max_blockfile_num);
    m_blockfile_info.resize(max_blockfile_num + 1);
    LogPrintf("%s: last block file = %i\n", __func__, max_blockfile_num);
    for (int nFile = 0; nFile <= max_blockfile_num; nFile++) {
        m_block_tree_db->ReadBlockFileInfo(nFile, m_blockfile_info[nFile]);
    }
    LogPrintf("%s: last block file info: %s\n", __func__, m_blockfile_info[max_blockfile_num].ToString());
    for (int nFile = max_blockfile_num + 1; true; nFile++) {
        CBlockFileInfo info;
        if (m_block_tree_db->ReadBlockFileInfo(nFile, info)) {
            m_blockfile_info.push_back(info);
        } else {
            break;
        }
    }

    // Check presence of blk files
    LogPrintf("Checking all blk files are present...\n");
    std::set<int> setBlkDataFiles;
    for (const auto& [_, block_index] : m_block_index) {
        if (block_index.nStatus & BLOCK_HAVE_DATA) {
            setBlkDataFiles.insert(block_index.nFile);
        }
    }
    for (std::set<int>::iterator it = setBlkDataFiles.begin(); it != setBlkDataFiles.end(); it++) {
        FlatFilePos pos(*it, 0);
        if (OpenBlockFile(pos, true).IsNull()) {
            return false;
        }
    }

    {
        // Initialize the blockfile cursors.
        LOCK(cs_LastBlockFile);
        for (size_t i = 0; i < m_blockfile_info.size(); ++i) {
            const auto last_height_in_file = m_blockfile_info[i].nHeightLast;
            m_blockfile_cursors[BlockfileTypeForHeight(last_height_in_file)] = {static_cast<int>(i), 0};
        }
    }

    // Check whether we have ever pruned block & undo files
    m_block_tree_db->ReadFlag("prunedblockfiles", m_have_pruned);
    if (m_have_pruned) {
        LogPrintf("LoadBlockIndexDB(): Block files have previously been pruned\n");
    }

    // Check whether we need to continue reindexing
    bool fReindexing = false;
    m_block_tree_db->ReadReindexing(fReindexing);
    if (fReindexing) m_blockfiles_indexed = false;

    return true;
}